

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3aTextureFilteringTests.cpp
# Opt level: O3

void deqp::gles3::Accuracy::renderFaces
               (Functions *gl,SurfaceAccess *dstRef,TextureCube *refTexture,ReferenceParams *params,
               TextureRenderer *renderer,int x,int y,int width,int height,Vec2 *bottomLeft,
               Vec2 *topRight,Vec2 *texCoordTopRightFactor)

{
  CubeFace CVar1;
  GLsizei height_00;
  GLenum err;
  ulong uVar2;
  ulong uVar3;
  int width_00;
  int x_00;
  undefined4 in_register_0000008c;
  int iVar4;
  CubeFace face;
  int y_00;
  vector<float,_std::allocator<float>_> local_e8;
  Functions *local_c8;
  ulong local_c0;
  ReferenceParams *local_b8;
  long local_b0;
  TextureCubeView *local_a8;
  SurfaceAccess *local_a0;
  TextureRenderer *local_98;
  undefined8 local_90;
  TextureCubeView local_88;
  SurfaceAccess local_50;
  
  local_90 = CONCAT44(in_register_0000008c,x);
  local_b0 = (long)width;
  local_e8.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_start = (float *)0x0;
  local_e8.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  local_e8.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  local_c0 = (ulong)(uint)(width / 3);
  iVar4 = height / 2;
  local_a8 = &refTexture->m_view;
  face = CUBEFACE_NEGATIVE_X;
  local_c8 = gl;
  local_b8 = params;
  local_a0 = dstRef;
  local_98 = renderer;
  do {
    CVar1 = face - CUBEFACE_POSITIVE_Y;
    if (face < CUBEFACE_POSITIVE_Y) {
      CVar1 = face;
    }
    y_00 = 0;
    if (face >= CUBEFACE_POSITIVE_Y) {
      y_00 = iVar4;
    }
    x_00 = CVar1 * (int)local_c0;
    if ((face == CUBEFACE_POSITIVE_Z) || (width_00 = (int)local_c0, face == CUBEFACE_NEGATIVE_Y)) {
      width_00 = (int)local_b0 - x_00;
    }
    height_00 = iVar4;
    if (CUBEFACE_NEGATIVE_Y < face) {
      height_00 = height - iVar4;
    }
    glu::TextureTestUtil::computeQuadTexCoordCube(&local_e8,face,bottomLeft,topRight);
    uVar2 = (ulong)(face < CUBEFACE_NEGATIVE_Y);
    uVar3 = (ulong)((face & CUBEFACE_LAST) == CUBEFACE_NEGATIVE_Y);
    local_e8.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
    _M_start[uVar2 * 2 + 6] =
         texCoordTopRightFactor->m_data[0] *
         local_e8.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
         _M_start[uVar2 * 2 + 6];
    local_e8.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
    _M_start[uVar2 * 2 + 9] =
         texCoordTopRightFactor->m_data[0] *
         local_e8.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
         _M_start[uVar2 * 2 + 9];
    local_e8.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
    _M_start[uVar3 + 4] =
         texCoordTopRightFactor->m_data[1] *
         local_e8.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
         _M_start[uVar3 + 4];
    local_e8.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
    _M_start[uVar3 + 10] =
         texCoordTopRightFactor->m_data[1] *
         local_e8.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
         _M_start[uVar3 + 10];
    (*local_c8->viewport)(x_00 + (int)local_90,y_00 + y,width_00,height_00);
    deqp::gls::TextureTestUtil::TextureRenderer::renderQuad
              (local_98,0,
               local_e8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
               super__Vector_impl_data._M_start,&local_b8->super_RenderParams);
    tcu::SurfaceAccess::SurfaceAccess(&local_50,local_a0,x_00,y_00,width_00,height_00);
    local_88.m_levels[5] = local_a8->m_levels[5];
    local_88.m_numLevels = local_a8->m_numLevels;
    local_88._4_4_ = *(undefined4 *)&local_a8->field_0x4;
    local_88.m_levels[0] = local_a8->m_levels[0];
    local_88.m_levels[1] = local_a8->m_levels[1];
    local_88.m_levels[2] = local_a8->m_levels[2];
    local_88.m_levels[3] = local_a8->m_levels[3];
    local_88.m_levels[4] = local_a8->m_levels[4];
    glu::TextureTestUtil::sampleTexture
              (&local_50,&local_88,
               local_e8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
               super__Vector_impl_data._M_start,local_b8);
    face = face + CUBEFACE_POSITIVE_X;
  } while (face != CUBEFACE_LAST);
  err = (*local_c8->getError)();
  glu::checkError(err,"Post render",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles3/accuracy/es3aTextureFilteringTests.cpp"
                  ,0x20b);
  if (local_e8.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
      _M_start != (float *)0x0) {
    operator_delete(local_e8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_e8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_e8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

static void renderFaces (
	const glw::Functions&		gl,
	const tcu::SurfaceAccess&	dstRef,
	const tcu::TextureCube&		refTexture,
	const ReferenceParams&		params,
	TextureRenderer&			renderer,
	int							x,
	int							y,
	int							width,
	int							height,
	const tcu::Vec2&			bottomLeft,
	const tcu::Vec2&			topRight,
	const tcu::Vec2&			texCoordTopRightFactor)
{
	DE_ASSERT(width == dstRef.getWidth() && height == dstRef.getHeight());

	vector<float> texCoord;

	DE_STATIC_ASSERT(tcu::CUBEFACE_LAST == 6);
	for (int face = 0; face < tcu::CUBEFACE_LAST; face++)
	{
		bool	isRightmost		= (face == 2) || (face == 5);
		bool	isTop			= face >= 3;
		int		curX			= (face % 3) * (width  / 3);
		int		curY			= (face / 3) * (height / 2);
		int		curW			= isRightmost	? (width-curX)	: (width	/ 3);
		int		curH			= isTop			? (height-curY)	: (height	/ 2);

		computeQuadTexCoordCube(texCoord, (tcu::CubeFace)face, bottomLeft, topRight);

		{
			// Move the top and right edges of the texture coord quad. This is useful when we want a cube edge visible.
			int texCoordSRow = face == tcu::CUBEFACE_NEGATIVE_X || face == tcu::CUBEFACE_POSITIVE_X ? 2 : 0;
			int texCoordTRow = face == tcu::CUBEFACE_NEGATIVE_Y || face == tcu::CUBEFACE_POSITIVE_Y ? 2 : 1;
			texCoord[6 + texCoordSRow] *= texCoordTopRightFactor.x();
			texCoord[9 + texCoordSRow] *= texCoordTopRightFactor.x();
			texCoord[3 + texCoordTRow] *= texCoordTopRightFactor.y();
			texCoord[9 + texCoordTRow] *= texCoordTopRightFactor.y();
		}

		gl.viewport(x+curX, y+curY, curW, curH);

		renderer.renderQuad(0, &texCoord[0], params);

		sampleTexture(tcu::SurfaceAccess(dstRef, curX, curY, curW, curH), refTexture, &texCoord[0], params);
	}

	GLU_EXPECT_NO_ERROR(gl.getError(), "Post render");
}